

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  value_type *pvVar1;
  int local_14;
  int i;
  ImDrawList *this_local;
  
  ImVector<ImDrawCmd>::clear(&this->CmdBuffer);
  ImVector<unsigned_short>::clear(&this->IdxBuffer);
  ImVector<ImDrawVert>::clear(&this->VtxBuffer);
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::clear(&this->_ClipRectStack);
  ImVector<void_*>::clear(&this->_TextureIdStack);
  ImVector<ImVec2>::clear(&this->_Path);
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  for (local_14 = 0; local_14 < (this->_Channels).Size; local_14 = local_14 + 1) {
    if (local_14 == 0) {
      pvVar1 = ImVector<ImDrawChannel>::operator[](&this->_Channels,0);
      memset(pvVar1,0,0x20);
    }
    pvVar1 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_14);
    ImVector<ImDrawCmd>::clear(&pvVar1->CmdBuffer);
    pvVar1 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_14);
    ImVector<unsigned_short>::clear(&pvVar1->IdxBuffer);
  }
  ImVector<ImDrawChannel>::clear(&this->_Channels);
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}